

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool __thiscall
kj::ArrayPtr<char_const*const>::operator==
          (ArrayPtr<char_const*const> *this,ArrayPtr<const_kj::StringPtr> *other)

{
  StringPtr *pSVar1;
  char *__s;
  bool bVar2;
  size_t sVar3;
  size_t i;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  ArrayPtr<const_char> local_40;
  
  if (*(size_t *)(this + 8) == other->size_) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      bVar6 = *(ulong *)(this + 8) <= uVar4;
      if (bVar6) {
        return bVar6;
      }
      pSVar1 = other->ptr;
      __s = *(char **)(*(long *)this + uVar4 * 8);
      sVar3 = strlen(__s);
      local_40.size_ = sVar3 + 1;
      local_40.ptr = __s;
      bVar2 = ArrayPtr<const_char>::operator==
                        ((ArrayPtr<const_char> *)((long)&(pSVar1->content).ptr + lVar5),&local_40);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (bVar2);
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

inline constexpr bool operator==(const ArrayPtr<U>& other) const {
    if (size_ != other.size()) return false;
    for (size_t i = 0; i < size_; i++) {
      if (ptr[i] != other[i]) return false;
    }
    return true;
  }